

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

natwm_error stack_push(stack *stack,void *data)

{
  stack_item *item_00;
  stack_item *item;
  void *data_local;
  stack *stack_local;
  
  item_00 = stack_item_create(data);
  if (item_00 == (stack_item *)0x0) {
    stack_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    stack_push_item(stack,item_00);
    stack_local._4_4_ = NO_ERROR;
  }
  return stack_local._4_4_;
}

Assistant:

enum natwm_error stack_push(struct stack *stack, void *data)
{
        struct stack_item *item = stack_item_create(data);

        if (item == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        stack_push_item(stack, item);

        return NO_ERROR;
}